

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

void ReadableSizeString(size_t SizeInBytes,char *Output,size_t size)

{
  long lVar1;
  size_t LastSizeInBytes;
  size_t sVar2;
  undefined1 auVar3 [16];
  
  lVar1 = 0;
  for (sVar2 = SizeInBytes; 0x400 < sVar2; sVar2 = sVar2 >> 10) {
    lVar1 = lVar1 + 8;
    SizeInBytes = sVar2;
  }
  if ((int)lVar1 != 0 && sVar2 < 100) {
    auVar3._8_4_ = (int)(SizeInBytes >> 0x20);
    auVar3._0_8_ = SizeInBytes;
    auVar3._12_4_ = 0x45300000;
    snprintf(Output,0x100,"%.1f %s",
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)SizeInBytes) - 4503599627370496.0)) * 0.0009765625,
             *(undefined8 *)(&DAT_0012fc10 + lVar1));
    return;
  }
  snprintf(Output,0x100,"%zd %s",sVar2,*(undefined8 *)(&DAT_0012fc10 + lVar1));
  return;
}

Assistant:

static void ReadableSizeString(size_t SizeInBytes, char *Output, size_t size)
{
    int i = 0;
    size_t LastSizeInBytes = SizeInBytes;
    char *byteUnits[] = {"bytes", "kB", "MB", "GB", "TB", "PB", "EB", "ZB", "YB"};

    while (SizeInBytes > 1024)
    {
        LastSizeInBytes = SizeInBytes;
        SizeInBytes = SizeInBytes / 1024;
        i++;
    }

    if ((SizeInBytes < 100) && (i != 0))
    {
        snprintf(Output, size, "%.1f %s", ((double)LastSizeInBytes) / 1024, byteUnits[i]);
    }
    else
    {
        snprintf(Output, size, "%zd %s", SizeInBytes, byteUnits[i]);
    }
}